

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__compute_huffman_codes(stbi__zbuf *a)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  stbi_uc fill;
  int c;
  int s;
  int ntot;
  int hclen;
  int hdist;
  int hlit;
  int n;
  int i;
  stbi_uc codelength_sizes [19];
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  int in_stack_fffffffffffff5ec;
  uint7 in_stack_fffffffffffff5f0;
  byte in_stack_fffffffffffff5f7;
  int in_stack_fffffffffffff5f8;
  uint in_stack_fffffffffffff5fc;
  int local_9f0;
  int local_9ec;
  undefined1 local_9e8 [32];
  byte local_9c8 [84];
  int in_stack_fffffffffffff68c;
  stbi_uc *in_stack_fffffffffffff690;
  stbi__zhuffman *in_stack_fffffffffffff698;
  int local_4;
  
  uVar1 = stbi__zreceive((stbi__zbuf *)CONCAT17(in_stack_fffffffffffff5f7,in_stack_fffffffffffff5f0)
                         ,in_stack_fffffffffffff5ec);
  uVar2 = stbi__zreceive((stbi__zbuf *)CONCAT17(in_stack_fffffffffffff5f7,in_stack_fffffffffffff5f0)
                         ,in_stack_fffffffffffff5ec);
  uVar3 = stbi__zreceive((stbi__zbuf *)CONCAT17(in_stack_fffffffffffff5f7,in_stack_fffffffffffff5f0)
                         ,in_stack_fffffffffffff5ec);
  iVar4 = uVar1 + uVar2 + 0x102;
  memset(local_9e8,0,0x13);
  for (local_9ec = 0; local_9ec < (int)(uVar3 + 4); local_9ec = local_9ec + 1) {
    in_stack_fffffffffffff5fc =
         stbi__zreceive((stbi__zbuf *)CONCAT17(in_stack_fffffffffffff5f7,in_stack_fffffffffffff5f0),
                        in_stack_fffffffffffff5ec);
    local_9e8["\x10\x11\x12"[local_9ec]] = (char)in_stack_fffffffffffff5fc;
  }
  iVar5 = stbi__zbuild_huffman
                    (in_stack_fffffffffffff698,in_stack_fffffffffffff690,in_stack_fffffffffffff68c);
  if (iVar5 == 0) {
    local_4 = 0;
  }
  else {
    local_9f0 = 0;
    while (local_9f0 < iVar4) {
      in_stack_fffffffffffff5f8 =
           stbi__zhuffman_decode
                     ((stbi__zbuf *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
                      (stbi__zhuffman *)
                      CONCAT17(in_stack_fffffffffffff5f7,in_stack_fffffffffffff5f0));
      if ((in_stack_fffffffffffff5f8 < 0) || (0x12 < in_stack_fffffffffffff5f8)) {
        iVar4 = stbi__err((char *)CONCAT17(in_stack_fffffffffffff5f7,in_stack_fffffffffffff5f0));
        return iVar4;
      }
      if (in_stack_fffffffffffff5f8 < 0x10) {
        local_9c8[local_9f0] = (byte)in_stack_fffffffffffff5f8;
        local_9f0 = local_9f0 + 1;
      }
      else {
        in_stack_fffffffffffff5f7 = 0;
        if (in_stack_fffffffffffff5f8 == 0x10) {
          uVar1 = stbi__zreceive((stbi__zbuf *)(ulong)in_stack_fffffffffffff5f0,
                                 in_stack_fffffffffffff5ec);
          in_stack_fffffffffffff5f8 = uVar1 + 3;
          if (local_9f0 == 0) {
            iVar4 = stbi__err((char *)CONCAT17(in_stack_fffffffffffff5f7,in_stack_fffffffffffff5f0))
            ;
            return iVar4;
          }
          in_stack_fffffffffffff5f7 = local_9c8[local_9f0 + -1];
        }
        else if (in_stack_fffffffffffff5f8 == 0x11) {
          uVar1 = stbi__zreceive((stbi__zbuf *)(ulong)in_stack_fffffffffffff5f0,
                                 in_stack_fffffffffffff5ec);
          in_stack_fffffffffffff5f8 = uVar1 + 3;
        }
        else {
          if (in_stack_fffffffffffff5f8 != 0x12) {
            iVar4 = stbi__err((char *)(ulong)in_stack_fffffffffffff5f0);
            return iVar4;
          }
          uVar1 = stbi__zreceive((stbi__zbuf *)(ulong)in_stack_fffffffffffff5f0,
                                 in_stack_fffffffffffff5ec);
          in_stack_fffffffffffff5f8 = uVar1 + 0xb;
        }
        if (iVar4 - local_9f0 < in_stack_fffffffffffff5f8) {
          iVar4 = stbi__err((char *)CONCAT17(in_stack_fffffffffffff5f7,in_stack_fffffffffffff5f0));
          return iVar4;
        }
        memset(local_9c8 + local_9f0,(uint)in_stack_fffffffffffff5f7,(long)in_stack_fffffffffffff5f8
              );
        local_9f0 = in_stack_fffffffffffff5f8 + local_9f0;
      }
    }
    if (local_9f0 == iVar4) {
      iVar4 = stbi__zbuild_huffman
                        (in_stack_fffffffffffff698,in_stack_fffffffffffff690,
                         in_stack_fffffffffffff68c);
      if (iVar4 == 0) {
        local_4 = 0;
      }
      else {
        iVar4 = stbi__zbuild_huffman
                          (in_stack_fffffffffffff698,in_stack_fffffffffffff690,
                           in_stack_fffffffffffff68c);
        if (iVar4 == 0) {
          local_4 = 0;
        }
        else {
          local_4 = 1;
        }
      }
    }
    else {
      local_4 = stbi__err((char *)CONCAT17(in_stack_fffffffffffff5f7,in_stack_fffffffffffff5f0));
    }
  }
  return local_4;
}

Assistant:

static int stbi__compute_huffman_codes(stbi__zbuf *a)
{
   static const stbi_uc length_dezigzag[19] = { 16,17,18,0,8,7,9,6,10,5,11,4,12,3,13,2,14,1,15 };
   stbi__zhuffman z_codelength;
   stbi_uc lencodes[286+32+137];//padding for maximum single op
   stbi_uc codelength_sizes[19];
   int i,n;

   int hlit  = stbi__zreceive(a,5) + 257;
   int hdist = stbi__zreceive(a,5) + 1;
   int hclen = stbi__zreceive(a,4) + 4;
   int ntot  = hlit + hdist;

   memset(codelength_sizes, 0, sizeof(codelength_sizes));
   for (i=0; i < hclen; ++i) {
      int s = stbi__zreceive(a,3);
      codelength_sizes[length_dezigzag[i]] = (stbi_uc) s;
   }
   if (!stbi__zbuild_huffman(&z_codelength, codelength_sizes, 19)) return 0;

   n = 0;
   while (n < ntot) {
      int c = stbi__zhuffman_decode(a, &z_codelength);
      if (c < 0 || c >= 19) return stbi__err("bad codelengths", "Corrupt PNG");
      if (c < 16)
         lencodes[n++] = (stbi_uc) c;
      else {
         stbi_uc fill = 0;
         if (c == 16) {
            c = stbi__zreceive(a,2)+3;
            if (n == 0) return stbi__err("bad codelengths", "Corrupt PNG");
            fill = lencodes[n-1];
         } else if (c == 17) {
            c = stbi__zreceive(a,3)+3;
         } else if (c == 18) {
            c = stbi__zreceive(a,7)+11;
         } else {
            return stbi__err("bad codelengths", "Corrupt PNG");
         }
         if (ntot - n < c) return stbi__err("bad codelengths", "Corrupt PNG");
         memset(lencodes+n, fill, c);
         n += c;
      }
   }
   if (n != ntot) return stbi__err("bad codelengths","Corrupt PNG");
   if (!stbi__zbuild_huffman(&a->z_length, lencodes, hlit)) return 0;
   if (!stbi__zbuild_huffman(&a->z_distance, lencodes+hlit, hdist)) return 0;
   return 1;
}